

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O0

static_string_view CxxModuleMapExtension(optional<CxxModuleMapFormat> format)

{
  bool bVar1;
  CxxModuleMapFormat *pCVar2;
  string_view sVar3;
  _Optional_payload_base<CxxModuleMapFormat> local_20;
  optional<CxxModuleMapFormat> format_local;
  
  local_20 = (_Optional_payload_base<CxxModuleMapFormat>)
             format.super__Optional_base<CxxModuleMapFormat,_true,_true>._M_payload.
             super__Optional_payload_base<CxxModuleMapFormat>;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_20);
  if (bVar1) {
    pCVar2 = std::optional<CxxModuleMapFormat>::operator*((optional<CxxModuleMapFormat> *)&local_20)
    ;
    if (*pCVar2 == Gcc) {
      sVar3 = (string_view)cm::operator____s(".gcm",4);
      return (static_string_view)sVar3;
    }
    if (*pCVar2 == Msvc) {
      sVar3 = (string_view)cm::operator____s(".ifc",4);
      return (static_string_view)sVar3;
    }
  }
  sVar3 = (string_view)cm::operator____s(".bmi",4);
  return (static_string_view)sVar3;
}

Assistant:

cm::static_string_view CxxModuleMapExtension(
  cm::optional<CxxModuleMapFormat> format)
{
  if (format) {
    switch (*format) {
      case CxxModuleMapFormat::Gcc:
        return ".gcm"_s;
      case CxxModuleMapFormat::Msvc:
        return ".ifc"_s;
    }
  }

  return ".bmi"_s;
}